

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O1

string * poplar::
         short_realname<poplar::map<poplar::compact_bonsai_trie<85u,3u,poplar::compact_hash_table<7u,80u,poplar::bijective_hash::split_mix_hasher>,poplar::standard_hash_table<80u,poplar::hash::vigna_hasher>,poplar::bijective_hash::split_mix_hasher>,poplar::compact_bonsai_nlm<int,16ul>>>
                   (void)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  char *__s;
  string *in_RDI;
  int status;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_38;
  
  __s = (char *)__cxa_demangle("N6poplar3mapINS_19compact_bonsai_trieILj85ELj3ENS_18compact_hash_tableILj7ELj80ENS_14bijective_hash16split_mix_hasherEEENS_19standard_hash_tableILj80ENS_4hash12vigna_hasherEEES4_EENS_18compact_bonsai_nlmIiLm16EEEEE"
                               ,0,0,&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)in_RDI,__s,(allocator<char> *)&local_38);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_38," |poplar::",0x10);
  local_50 = 0;
  local_48 = 0;
  _Var1._M_current = (in_RDI->_M_dataplus)._M_p;
  local_58 = &local_48;
  std::
  __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58,_Var1,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(_Var1._M_current + in_RDI->_M_string_length),&local_38,"",0,0);
  std::__cxx11::string::operator=((string *)in_RDI,(string *)&local_58);
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_38);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_38,"(\\d+)ul{0,2}",0x10);
  local_50 = 0;
  local_48 = 0;
  _Var1._M_current = (in_RDI->_M_dataplus)._M_p;
  local_58 = &local_48;
  std::
  __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58,_Var1,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(_Var1._M_current + in_RDI->_M_string_length),&local_38,"$1",2,0);
  std::__cxx11::string::operator=((string *)in_RDI,(string *)&local_58);
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_38);
  return in_RDI;
}

Assistant:

inline std::string short_realname() {
    auto name = realname<T>();
    name = std::regex_replace(name, std::regex{R"( |poplar::)"}, "");
    name = std::regex_replace(name, std::regex{R"((\d+)ul{0,2})"}, "$1");
    return name;
}